

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab.cpp
# Opt level: O0

void __thiscall cab::add_request(cab *this,node_type src,node_type dst,uint32_t passengers)

{
  road_network *prVar1;
  node_type nVar2;
  bool bVar3;
  node_type nVar4;
  bool bVar5;
  pair<bool,_bool> pVar6;
  uint32_t uVar7;
  size_type sVar8;
  reference pvVar9;
  element_type *this_00;
  uint32_t local_d0;
  uint32_t local_cc;
  undefined1 local_60 [8];
  shared_ptr<cab_session> shared;
  uint32_t cost_1;
  uint32_t cost;
  bool is_inner;
  size_t i_1;
  uint32_t max;
  bool found_dst;
  bool found_src;
  pair<bool,_bool> pair;
  size_t i;
  uint32_t passengers_local;
  node_type dst_local;
  node_type src_local;
  cab *this_local;
  
  for (_max = 0; sVar8 = std::vector<request,_std::allocator<request>_>::size(&this->_requests),
      _max < sVar8; _max = _max + 1) {
    pvVar9 = std::vector<request,_std::allocator<request>_>::operator[](&this->_requests,_max);
    nVar2 = request::src(pvVar9);
    if (nVar2 == src) {
      pvVar9 = std::vector<request,_std::allocator<request>_>::operator[](&this->_requests,_max);
      nVar2 = request::dst(pvVar9);
      if (nVar2 == dst) {
        pvVar9 = std::vector<request,_std::allocator<request>_>::operator[](&this->_requests,_max);
        request::add_passengers(pvVar9,passengers);
        return;
      }
    }
  }
  pVar6 = route_contains_ordered(this,src,dst);
  i_1._0_4_ = 0;
  _cost = 0;
  do {
    sVar8 = std::vector<request,_std::allocator<request>_>::size(&this->_requests);
    if (sVar8 <= _cost) {
      if (this->_costs < (uint32_t)i_1) {
        local_d0 = (uint32_t)i_1;
      }
      else {
        local_d0 = this->_costs;
      }
      this->_costs = local_d0;
      request::request((request *)
                       ((long)&shared.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi + 4),src,dst,passengers);
      std::vector<request,_std::allocator<request>_>::push_back
                (&this->_requests,
                 (value_type *)
                 ((long)&shared.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 4));
      std::weak_ptr<cab_session>::lock((weak_ptr<cab_session> *)local_60);
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_60);
      if (bVar3) {
        this_00 = std::__shared_ptr_access<cab_session,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<cab_session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_60);
        pvVar9 = std::vector<request,_std::allocator<request>_>::back(&this->_requests);
        cab_session::send_request(this_00,pvVar9);
      }
      std::shared_ptr<cab_session>::~shared_ptr((shared_ptr<cab_session> *)local_60);
      return;
    }
    bVar3 = road_network::is_inner(this->_rnet,src);
    if (((ushort)pVar6 & 1) == 0) {
      prVar1 = this->_rnet;
      nVar2 = this->_position;
      pvVar9 = std::vector<request,_std::allocator<request>_>::operator[](&this->_requests,_cost);
      nVar4 = request::src(pvVar9);
      bVar5 = road_network::in_between(prVar1,nVar2,nVar4,src);
      if (!bVar5) {
        prVar1 = this->_rnet;
        pvVar9 = std::vector<request,_std::allocator<request>_>::operator[](&this->_requests,_cost);
        nVar2 = request::src(pvVar9);
        pvVar9 = std::vector<request,_std::allocator<request>_>::operator[](&this->_requests,_cost);
        nVar4 = request::dst(pvVar9);
        bVar5 = road_network::in_between(prVar1,nVar2,nVar4,src);
        if (!bVar5) goto LAB_001461a9;
      }
      uVar7 = 2;
      if (bVar3) {
        uVar7 = 1;
      }
      pvVar9 = std::vector<request,_std::allocator<request>_>::operator[](&this->_requests,_cost);
      request::add_detours(pvVar9,uVar7);
    }
LAB_001461a9:
    bVar3 = road_network::is_inner(this->_rnet,dst);
    if (((ushort)pVar6 & 0x100) == 0) {
      prVar1 = this->_rnet;
      nVar2 = this->_position;
      pvVar9 = std::vector<request,_std::allocator<request>_>::operator[](&this->_requests,_cost);
      nVar4 = request::src(pvVar9);
      bVar5 = road_network::in_between(prVar1,nVar2,nVar4,dst);
      if (!bVar5) {
        prVar1 = this->_rnet;
        pvVar9 = std::vector<request,_std::allocator<request>_>::operator[](&this->_requests,_cost);
        nVar2 = request::src(pvVar9);
        pvVar9 = std::vector<request,_std::allocator<request>_>::operator[](&this->_requests,_cost);
        nVar4 = request::dst(pvVar9);
        bVar5 = road_network::in_between(prVar1,nVar2,nVar4,dst);
        if (!bVar5) goto LAB_001462ad;
      }
      uVar7 = 2;
      if (bVar3) {
        uVar7 = 1;
      }
      pvVar9 = std::vector<request,_std::allocator<request>_>::operator[](&this->_requests,_cost);
      request::add_detours(pvVar9,uVar7);
    }
LAB_001462ad:
    pvVar9 = std::vector<request,_std::allocator<request>_>::operator[](&this->_requests,_cost);
    uVar7 = request::detours(pvVar9);
    if ((uint32_t)i_1 < uVar7) {
      pvVar9 = std::vector<request,_std::allocator<request>_>::operator[](&this->_requests,_cost);
      local_cc = request::detours(pvVar9);
    }
    else {
      local_cc = (uint32_t)i_1;
    }
    i_1._0_4_ = local_cc;
    _cost = _cost + 1;
  } while( true );
}

Assistant:

void cab::add_request(node_type src, node_type dst, std::uint32_t passengers)
{
    for(std::size_t i = 0; i < _requests.size(); ++i)
    {
        if(_requests[i].src() == src && _requests[i].dst() == dst)
        {
            _requests[i].add_passengers(passengers);
            return;
        }
    }

    std::pair<bool, bool> pair = route_contains_ordered(src, dst);
    bool found_src = pair.first;
    bool found_dst = pair.second;

    // add detours to all requests
    // does the sme as calculate costs
    std::uint32_t max = 0;
    for(std::size_t i = 0; i < _requests.size(); ++i)
    {
        bool is_inner = _rnet->is_inner(src); 
        if(!found_src && (_rnet->in_between(_position, _requests[i].src(), src) || 
                _rnet->in_between(_requests[i].src(), _requests[i].dst(), src)))
        {
            std::uint32_t cost = is_inner ? 1 : 2;
            _requests[i].add_detours(cost);
        }

        is_inner = _rnet->is_inner(dst); 
        if(!found_dst && (_rnet->in_between(_position, _requests[i].src(), dst) || 
                _rnet->in_between(_requests[i].src(), _requests[i].dst(), dst)))
        {
            std::uint32_t cost = is_inner ? 1 : 2;
            _requests[i].add_detours(cost);
        }
        
        max = _requests[i].detours() > max ? _requests[i].detours() : max;
    }
    _costs = max > _costs ? max : _costs; 

    _requests.push_back(request(src, dst, passengers));

    // inform external controller
    if(auto shared = _cab_session.lock())
    {
        shared->send_request(_requests.back());
    }
}